

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

void __thiscall
QPDFObjectHandle::QPDFDictItems::iterator::iterator
          (iterator *this,QPDFObjectHandle *oh,bool for_begin)

{
  Members *this_00;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_002ef188;
  this_00 = (Members *)operator_new(0x48);
  Members::Members(this_00,oh,for_begin);
  (this->m).
  super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFObjectHandle::QPDFDictItems::iterator::Members*>
            (&(this->m).
              super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  (this->ivalue).first._M_dataplus._M_p = (pointer)&(this->ivalue).first.field_2;
  (this->ivalue).first._M_string_length = 0;
  (this->ivalue).first.field_2._M_local_buf[0] = '\0';
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  updateIValue(this);
  return;
}

Assistant:

QPDFObjectHandle::QPDFDictItems::iterator::iterator(QPDFObjectHandle& oh, bool for_begin) :
    m(new Members(oh, for_begin))
{
    updateIValue();
}